

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hpp
# Opt level: O0

void __thiscall
stateObservation::tools::SimplestStopwatch::SimplestStopwatch(SimplestStopwatch *this)

{
  SimplestStopwatch *this_local;
  
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->startTime);
  return;
}

Assistant:

struct STATE_OBSERVATION_DLLAPI SimplestStopwatch
{
  /** Always pick a steady clock */
  using clock = typename std::conditional<std::chrono::high_resolution_clock::is_steady,
                                          std::chrono::high_resolution_clock,
                                          std::chrono::steady_clock>::type;
  using time_ns = clock::time_point;
  time_ns startTime;

  inline void start()
  {
    startTime = clock::now();
  }

  /// provides the time since the start
  /// the value is in nanoseconds
  inline double stop()
  {
    auto elapsed = clock::now() - startTime;
    return static_cast<double>(elapsed.count());
  }
}